

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTQuaternion * __thiscall RTQuaternion::operator*=(RTQuaternion *this,RTQuaternion *qb)

{
  RTQuaternion qa;
  RTQuaternion local_28;
  
  RTQuaternion(&local_28);
  operator=(&local_28,this);
  this->m_data[0] =
       ((qb->m_data[0] * local_28.m_data[0] - qb->m_data[1] * local_28.m_data[1]) -
       qb->m_data[2] * local_28.m_data[2]) - qb->m_data[3] * local_28.m_data[3];
  this->m_data[1] =
       (qb->m_data[3] * local_28.m_data[2] +
       qb->m_data[1] * local_28.m_data[0] + qb->m_data[0] * local_28.m_data[1]) -
       qb->m_data[2] * local_28.m_data[3];
  this->m_data[2] =
       qb->m_data[1] * local_28.m_data[3] +
       qb->m_data[0] * local_28.m_data[2] +
       (qb->m_data[2] * local_28.m_data[0] - qb->m_data[3] * local_28.m_data[1]);
  this->m_data[3] =
       local_28.m_data[3] * qb->m_data[0] +
       ((local_28.m_data[0] * qb->m_data[3] + local_28.m_data[1] * qb->m_data[2]) -
       local_28.m_data[2] * qb->m_data[1]);
  return this;
}

Assistant:

RTQuaternion& RTQuaternion::operator *=(const RTQuaternion& qb)
{
    RTQuaternion qa;

    qa = *this;

    m_data[0] = qa.scalar() * qb.scalar() - qa.x() * qb.x() - qa.y() * qb.y() - qa.z() * qb.z();
    m_data[1] = qa.scalar() * qb.x() + qa.x() * qb.scalar() + qa.y() * qb.z() - qa.z() * qb.y();
    m_data[2] = qa.scalar() * qb.y() - qa.x() * qb.z() + qa.y() * qb.scalar() + qa.z() * qb.x();
    m_data[3] = qa.scalar() * qb.z() + qa.x() * qb.y() - qa.y() * qb.x() + qa.z() * qb.scalar();

    return *this;
}